

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# postgres_parser.cpp
# Opt level: O2

void __thiscall duckdb::PostgresParser::~PostgresParser(PostgresParser *this)

{
  duckdb_libpgquery::pg_parser_cleanup();
  ::std::__cxx11::string::~string((string *)&this->error_message);
  return;
}

Assistant:

PostgresParser::~PostgresParser()  {
    duckdb_libpgquery::pg_parser_cleanup();
}